

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcFault.c
# Opt level: O0

int Gia_ManFaultAddOne(Gia_Man_t *pM,Cnf_Dat_t *pCnf,sat_solver *pSat,Vec_Int_t *vLits,int nFuncVars
                      ,int fAddOr,Gia_Man_t *pGiaCnf)

{
  long lVar1;
  Cnf_Dat_t *pCVar2;
  Vec_Int_t *s;
  int iVar3;
  int iVar4;
  Cnf_Dat_t *p;
  Vec_Int_t *pVVar5;
  int *begin;
  int *piVar6;
  Gia_Obj_t *pObj_00;
  bool bVar7;
  Vec_Int_t *vOrGate;
  int Lit;
  int i;
  Gia_Obj_t *pObj;
  Cnf_Dat_t *pCnf2;
  Gia_Man_t *pC;
  int fAddOr_local;
  int nFuncVars_local;
  Vec_Int_t *vLits_local;
  sat_solver *pSat_local;
  Cnf_Dat_t *pCnf_local;
  Gia_Man_t *pM_local;
  
  pC._0_4_ = fAddOr;
  pC._4_4_ = nFuncVars;
  _fAddOr_local = vLits;
  vLits_local = (Vec_Int_t *)pSat;
  pSat_local = (sat_solver *)pCnf;
  pCnf_local = (Cnf_Dat_t *)pM;
  pCnf2 = (Cnf_Dat_t *)Gia_ManFaultCofactor(pM,vLits);
  p = Cnf_DeriveGiaRemapped((Gia_Man_t *)pCnf2);
  pCVar2 = pCnf2;
  pObj = (Gia_Obj_t *)p;
  iVar3 = sat_solver_nvars((sat_solver *)vLits_local);
  Cnf_DataLiftGia(p,(Gia_Man_t *)pCVar2,iVar3);
  for (vOrGate._4_4_ = 0; vOrGate._4_4_ < *(int *)&pObj[1].field_0x4;
      vOrGate._4_4_ = vOrGate._4_4_ + 1) {
    iVar3 = sat_solver_addclause
                      ((sat_solver *)vLits_local,
                       *(lit **)(*(long *)(pObj + 2) + (long)vOrGate._4_4_ * 8),
                       *(lit **)(*(long *)(pObj + 2) + (long)(vOrGate._4_4_ + 1) * 8));
    if (iVar3 == 0) {
      Cnf_DataFree((Cnf_Dat_t *)pObj);
      Gia_ManStop((Gia_Man_t *)pCnf2);
      return 0;
    }
  }
  if ((int)pC == 0) {
    vOrGate._4_4_ = 0;
    while( true ) {
      iVar3 = vOrGate._4_4_;
      iVar4 = Gia_ManPoNum((Gia_Man_t *)pCnf2);
      bVar7 = false;
      if (iVar3 < iVar4) {
        _Lit = Gia_ManCo((Gia_Man_t *)pCnf2,vOrGate._4_4_);
        bVar7 = _Lit != (Gia_Obj_t *)0x0;
      }
      if (!bVar7) goto LAB_006c354a;
      lVar1 = *(long *)&pObj[2].Value;
      iVar3 = Gia_ObjId((Gia_Man_t *)pCnf2,_Lit);
      vOrGate._0_4_ = Abc_Var2Lit(*(int *)(lVar1 + (long)iVar3 * 4),1);
      iVar3 = sat_solver_addclause
                        ((sat_solver *)vLits_local,(lit *)&vOrGate,(lit *)((long)&vOrGate + 4));
      if (iVar3 == 0) break;
      vOrGate._4_4_ = vOrGate._4_4_ + 1;
    }
    Cnf_DataFree((Cnf_Dat_t *)pObj);
    Gia_ManStop((Gia_Man_t *)pCnf2);
    pM_local._4_4_ = 0;
  }
  else {
    iVar3 = Gia_ManPoNum((Gia_Man_t *)pCnf2);
    pVVar5 = Vec_IntAlloc(iVar3);
    vOrGate._4_4_ = 0;
    while( true ) {
      iVar3 = vOrGate._4_4_;
      iVar4 = Gia_ManPoNum((Gia_Man_t *)pCnf2);
      bVar7 = false;
      if (iVar3 < iVar4) {
        _Lit = Gia_ManCo((Gia_Man_t *)pCnf2,vOrGate._4_4_);
        bVar7 = _Lit != (Gia_Obj_t *)0x0;
      }
      s = vLits_local;
      if (!bVar7) break;
      lVar1 = *(long *)&pObj[2].Value;
      iVar3 = Gia_ObjId((Gia_Man_t *)pCnf2,_Lit);
      vOrGate._0_4_ = Abc_Var2Lit(*(int *)(lVar1 + (long)iVar3 * 4),0);
      Vec_IntPush(pVVar5,(int)vOrGate);
      vOrGate._4_4_ = vOrGate._4_4_ + 1;
    }
    begin = Vec_IntArray(pVVar5);
    piVar6 = Vec_IntArray(pVVar5);
    iVar3 = Vec_IntSize(pVVar5);
    iVar3 = sat_solver_addclause((sat_solver *)s,begin,piVar6 + iVar3);
    if (iVar3 == 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcFault.c"
                    ,0x3ba,
                    "int Gia_ManFaultAddOne(Gia_Man_t *, Cnf_Dat_t *, sat_solver *, Vec_Int_t *, int, int, Gia_Man_t *)"
                   );
    }
    Vec_IntFree(pVVar5);
LAB_006c354a:
    if (pGiaCnf != (Gia_Man_t *)0x0) {
      vOrGate._4_4_ = 0;
      while( true ) {
        iVar3 = vOrGate._4_4_;
        iVar4 = Gia_ManPiNum(pGiaCnf);
        bVar7 = false;
        if (iVar3 < iVar4) {
          _Lit = Gia_ManCi(pGiaCnf,vOrGate._4_4_);
          bVar7 = _Lit != (Gia_Obj_t *)0x0;
        }
        pVVar5 = vLits_local;
        if (!bVar7) break;
        if (pC._4_4_ <= vOrGate._4_4_) {
          lVar1 = *(long *)(pSat_local->Mem).BookMarkE;
          iVar3 = Gia_ObjId(pGiaCnf,_Lit);
          pCVar2 = pCnf2;
          iVar3 = *(int *)(lVar1 + (long)iVar3 * 4);
          lVar1 = *(long *)&pObj[2].Value;
          pObj_00 = Gia_ManPi((Gia_Man_t *)pCnf2,vOrGate._4_4_);
          iVar4 = Gia_ObjId((Gia_Man_t *)pCVar2,pObj_00);
          sat_solver_add_buffer((sat_solver *)pVVar5,iVar3,*(int *)(lVar1 + (long)iVar4 * 4),0);
        }
        vOrGate._4_4_ = vOrGate._4_4_ + 1;
      }
    }
    Cnf_DataFree((Cnf_Dat_t *)pObj);
    Gia_ManStop((Gia_Man_t *)pCnf2);
    pM_local._4_4_ = 1;
  }
  return pM_local._4_4_;
}

Assistant:

int Gia_ManFaultAddOne( Gia_Man_t * pM, Cnf_Dat_t * pCnf, sat_solver * pSat, Vec_Int_t * vLits, int nFuncVars, int fAddOr, Gia_Man_t * pGiaCnf )
{
    Gia_Man_t * pC;//, * pTemp;
    Cnf_Dat_t * pCnf2;
    Gia_Obj_t * pObj;
    int i, Lit;
    // derive the cofactor
    pC = Gia_ManFaultCofactor( pM, vLits );
    // derive new CNF
    pCnf2 = Cnf_DeriveGiaRemapped( pC );
    Cnf_DataLiftGia( pCnf2, pC, sat_solver_nvars(pSat) );
    // add timeframe clauses
    for ( i = 0; i < pCnf2->nClauses; i++ )
        if ( !sat_solver_addclause( pSat, pCnf2->pClauses[i], pCnf2->pClauses[i+1] ) )
        {
            Cnf_DataFree( pCnf2 );
            Gia_ManStop( pC );
            return 0;
        }
    // add constraint clauses
    if ( fAddOr )
    {
        // add one OR gate to assert difference of at least one output of the miter
        Vec_Int_t * vOrGate = Vec_IntAlloc( Gia_ManPoNum(pC) );
        Gia_ManForEachPo( pC, pObj, i )
        {
            Lit = Abc_Var2Lit( pCnf2->pVarNums[Gia_ObjId(pC, pObj)], 0 );
            Vec_IntPush( vOrGate, Lit );
        }
        if ( !sat_solver_addclause( pSat, Vec_IntArray(vOrGate), Vec_IntArray(vOrGate) + Vec_IntSize(vOrGate) ) )
            assert( 0 );
        Vec_IntFree( vOrGate );
    }
    else
    {
        // add negative literals to assert equality of all outputs of the miter
        Gia_ManForEachPo( pC, pObj, i )
        {
            Lit = Abc_Var2Lit( pCnf2->pVarNums[Gia_ObjId(pC, pObj)], 1 );
            if ( !sat_solver_addclause( pSat, &Lit, &Lit+1 ) )
            {
                Cnf_DataFree( pCnf2 );
                Gia_ManStop( pC );
                return 0;
            }
        }
    }
    // add connection clauses
    if ( pGiaCnf )
    {
        Gia_ManForEachPi( pGiaCnf, pObj, i )
            if ( i >= nFuncVars )
                sat_solver_add_buffer( pSat, pCnf->pVarNums[Gia_ObjId(pGiaCnf, pObj)], pCnf2->pVarNums[Gia_ObjId(pC, Gia_ManPi(pC, i))], 0 );
    }
    Cnf_DataFree( pCnf2 );
    Gia_ManStop( pC );
    return 1;
}